

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O1

int CfdGetConfidentialTxInfo
              (void *handle,char *tx_hex_string,char **txid,char **wtxid,char **wit_hash,
              uint32_t *size,uint32_t *vsize,uint32_t *weight,uint32_t *version,uint32_t *locktime)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  uint32_t uVar3;
  ConfidentialTransaction *this;
  CfdException *this_00;
  char *work_wit_hash;
  char *work_wtxid;
  char *work_txid;
  ConfidentialTransactionController ctxc;
  Txid local_f8;
  void *local_d8;
  string local_d0;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  ByteData256 local_98;
  ConfidentialTransactionController local_80;
  
  local_a0 = (char *)0x0;
  local_a8 = (char *)0x0;
  local_b0 = (char *)0x0;
  local_d8 = handle;
  cfd::Initialize();
  bVar2 = cfd::capi::IsEmptyString(tx_hex_string);
  if (!bVar2) {
    std::__cxx11::string::string((string *)&local_d0,tx_hex_string,(allocator *)&local_f8);
    cfd::ConfidentialTransactionController::ConfidentialTransactionController(&local_80,&local_d0);
    paVar1 = &local_d0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    this = cfd::ConfidentialTransactionController::GetTransaction(&local_80);
    if (txid != (char **)0x0) {
      cfd::core::AbstractTransaction::GetTxid(&local_f8,&this->super_AbstractTransaction);
      cfd::core::Txid::GetHex_abi_cxx11_(&local_d0,&local_f8);
      local_a0 = cfd::capi::CreateString(&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      local_f8._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
      if (local_f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    if (wtxid != (char **)0x0) {
      cfd::core::AbstractTransaction::GetWitnessHash(&local_98,&this->super_AbstractTransaction);
      cfd::core::Txid::Txid(&local_f8,&local_98);
      cfd::core::Txid::GetHex_abi_cxx11_(&local_d0,&local_f8);
      local_a8 = cfd::capi::CreateString(&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      local_f8._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
      if (local_f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    if (wit_hash != (char **)0x0) {
      cfd::core::ConfidentialTransaction::GetWitnessOnlyHash(&local_98,this);
      cfd::core::Txid::Txid(&local_f8,&local_98);
      cfd::core::Txid::GetHex_abi_cxx11_(&local_d0,&local_f8);
      local_b0 = cfd::capi::CreateString(&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      local_f8._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
      if (local_f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    if (size != (uint32_t *)0x0) {
      uVar3 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[4])(this);
      *size = uVar3;
    }
    if (vsize != (uint32_t *)0x0) {
      uVar3 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[5])(this);
      *vsize = uVar3;
    }
    if (weight != (uint32_t *)0x0) {
      uVar3 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[6])(this);
      *weight = uVar3;
    }
    if (version != (uint32_t *)0x0) {
      uVar3 = cfd::core::AbstractTransaction::GetVersion(&this->super_AbstractTransaction);
      *version = uVar3;
    }
    if (locktime != (uint32_t *)0x0) {
      uVar3 = cfd::core::AbstractTransaction::GetLockTime(&this->super_AbstractTransaction);
      *locktime = uVar3;
    }
    if (local_a0 != (char *)0x0) {
      *txid = local_a0;
    }
    if (local_a8 != (char *)0x0) {
      *wtxid = local_a8;
    }
    if (local_b0 != (char *)0x0) {
      *wit_hash = local_b0;
    }
    local_80.super_AbstractTransactionController._vptr_AbstractTransactionController =
         (_func_int **)&PTR__ConfidentialTransactionController_00735388;
    cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&local_80.transaction_);
    return 0;
  }
  local_80.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)0x5f3c92;
  local_80.super_AbstractTransactionController.tx_address_._0_4_ = 0x193;
  local_80.transaction_.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x5f3dc1
  ;
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&local_80,kCfdLogLevelWarning,"tx is null or empty.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_80.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)&local_80.transaction_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"Failed to parameter. tx is null or empty.","");
  cfd::core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&local_80);
  __cxa_throw(this_00,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetConfidentialTxInfo(
    void* handle, const char* tx_hex_string, char** txid, char** wtxid,
    char** wit_hash, uint32_t* size, uint32_t* vsize, uint32_t* weight,
    uint32_t* version, uint32_t* locktime) {
  int error_code = CfdErrorCode::kCfdUnknownError;
  char* work_txid = nullptr;
  char* work_wtxid = nullptr;
  char* work_wit_hash = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    ConfidentialTransactionController ctxc(tx_hex_string);
    const ConfidentialTransaction& tx = ctxc.GetTransaction();

    if (txid != nullptr) {
      work_txid = CreateString(tx.GetTxid().GetHex());
    }
    if (wtxid != nullptr) {
      work_wtxid = CreateString(Txid(tx.GetWitnessHash()).GetHex());
    }
    if (wit_hash != nullptr) {
      work_wit_hash = CreateString(Txid(tx.GetWitnessOnlyHash()).GetHex());
    }
    if (size != nullptr) {
      *size = tx.GetTotalSize();
    }
    if (vsize != nullptr) {
      *vsize = tx.GetVsize();
    }
    if (weight != nullptr) {
      *weight = tx.GetWeight();
    }
    if (version != nullptr) {
      *version = tx.GetVersion();
    }
    if (locktime != nullptr) {
      *locktime = tx.GetLockTime();
    }

    if (work_txid != nullptr) *txid = work_txid;
    if (work_wtxid != nullptr) *wtxid = work_wtxid;
    if (work_wit_hash != nullptr) *wit_hash = work_wit_hash;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    error_code = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_txid, &work_wtxid, &work_wit_hash);
  return error_code;
}